

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O0

void b64To(void *dest,size_t *count,char *src)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  byte *in_RDX;
  long *in_RSI;
  undefined1 *in_RDI;
  size_t len;
  u32 block;
  ulong local_28;
  byte *local_18;
  undefined1 *local_8;
  
  sVar3 = strLen((char *)0x12211d);
  local_28 = sVar3;
  if (((sVar3 != 0) && (in_RDX[sVar3 - 1] == 0x3d)) &&
     (local_28 = sVar3 - 1, in_RDX[sVar3 - 2] == 0x3d)) {
    local_28 = sVar3 - 2;
  }
  *in_RSI = (local_28 >> 2) * 3 + (local_28 & 1) + (local_28 >> 1 & 1);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_RDI != (undefined1 *)0x0) {
    for (; 3 < local_28; local_28 = local_28 - 4) {
      iVar1 = ((uint)b64_dec_table[local_18[2]] |
              ((uint)b64_dec_table[local_18[1]] | (uint)b64_dec_table[*local_18] << 6) << 6) << 6;
      local_8[2] = b64_dec_table[local_18[3]] | (byte)iVar1;
      local_8[1] = (char)((uint)iVar1 >> 8);
      *local_8 = (char)((uint)iVar1 >> 0x10);
      local_18 = local_18 + 4;
      local_8 = local_8 + 3;
    }
    if (local_28 == 3) {
      uVar2 = ((uint)b64_dec_table[local_18[2]] |
              ((uint)b64_dec_table[local_18[1]] | (uint)b64_dec_table[*local_18] << 6) << 6) >> 2;
      local_8[1] = (char)uVar2;
      *local_8 = (char)(uVar2 >> 8);
    }
    else if (local_28 == 2) {
      *local_8 = (char)(((uint)b64_dec_table[local_18[1]] | (uint)b64_dec_table[*local_18] << 6) >>
                       4);
    }
  }
  return;
}

Assistant:

void b64To(void* dest, size_t* count, const char* src)
{
	register u32 block;
	size_t len;
	ASSERT(b64IsValid(src));
	ASSERT(memIsValid(count, sizeof(size_t)));
	ASSERT(memIsNullOrValid(dest, *count));
	// размер dest
	len = strLen(src);
	if (len && src[len - 1] == '=' && src[--len - 1] == '=')
		--len;
	ASSERT(dest ? *count >= 3 * (len / 4) + (len & 1) + (len >> 1 & 1) : TRUE);
	*count = 3 * (len / 4) + (len & 1) + (len >> 1 & 1);
	if (dest == 0)
		return;
	// декодировать
	ASSERT(memIsDisjoint2(src, strLen(src) + 1, dest, *count));
	for (; len >= 4; len -= 4)
	{
		block  = b64_dec_table[(octet)src[0]], block <<= 6;
		block |= b64_dec_table[(octet)src[1]], block <<= 6;
		block |= b64_dec_table[(octet)src[2]], block <<= 6;
		block |= b64_dec_table[(octet)src[3]];
		((octet*)dest)[2] = block & 255, block >>= 8;
		((octet*)dest)[1] = block & 255, block >>= 8;
		((octet*)dest)[0] = block;
		src += 4;
		dest = (octet*)dest + 3;
	}
	if (len == 3)
	{
		block  = b64_dec_table[(octet)src[0]], block <<= 6;
		block |= b64_dec_table[(octet)src[1]], block <<= 6;
		block |= b64_dec_table[(octet)src[2]], block >>= 2;
		((octet*)dest)[1] = block & 255, block >>= 8;
		((octet*)dest)[0] = block;
	}
	else if (len == 2)
	{
		block  = b64_dec_table[(octet)src[0]], block <<= 6;
		block |= b64_dec_table[(octet)src[1]], block >>= 4;
		((octet*)dest)[0] = block;
	}
	block = 0;
}